

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

RequestConnectOrProtocolError * __thiscall
kj::HttpHeaders::tryParseRequestOrConnect
          (RequestConnectOrProtocolError *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  bool bVar1;
  char *end;
  ArrayPtr<char> content_00;
  char *ptr;
  RequestConnectOrProtocolError result;
  kj *local_f0;
  int local_e8;
  int local_e4;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  local_c8;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  local_88;
  
  content_00.size_ = (kj *)content.ptr;
  content_00.ptr = (char *)content.size_;
  end = trimHeaderEnding(content_00.size_,content_00);
  if (end == (char *)0x0) {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Request headers have no terminal newline.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2a;
    goto LAB_00307616;
  }
  local_88.tag = 0;
  local_f0 = content_00.size_;
  consumeHttpMethod((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)&local_c8,
                    (char **)&local_f0);
  if (((char)local_c8.tag != '\x01') || ((*local_f0 != (kj)0x20 && (*local_f0 != (kj)0x9)))) {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f5;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Not Implemented";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0x10;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = "Unrecognized request method.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x1d;
    goto LAB_00307616;
  }
  local_e4 = local_c8.field_1._0_4_;
  local_e8 = local_c8.field_1._8_4_;
  local_f0 = local_f0 + 1;
  consumeWord((Maybe<kj::StringPtr> *)&local_c8,(char **)&local_f0);
  if ((char)local_c8.tag != '\x01') {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = "Invalid request line.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x16;
    goto LAB_00307616;
  }
  if (local_e4 == 2) {
    local_c8.tag = 2;
LAB_003075aa:
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::operator=(&local_88,&local_c8);
  }
  else if (local_e4 == 1) {
    local_c8.tag = 1;
    local_c8.field_1._0_4_ = local_e8;
    local_c8.field_1._20_4_ = local_c8.field_1._12_4_;
    goto LAB_003075aa;
  }
  consumeLine((char **)&local_f0);
  bVar1 = parseHeaders(this,(char *)local_f0,end);
  if (bVar1) {
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::moveFrom(__return_storage_ptr__,&local_88);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->tag = 3;
  *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
  *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
  *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
       "The headers sent by your client are not valid.";
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2f;
LAB_00307616:
  *(kj **)((long)&__return_storage_ptr__->field_1 + 0x28) = content_00.size_;
  *(char **)((long)&__return_storage_ptr__->field_1 + 0x30) = (char *)content.size_;
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::RequestConnectOrProtocolError HttpHeaders::tryParseRequestOrConnect(
    kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 400, "Bad Request",
        "Request headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::RequestConnectOrProtocolError result;

  KJ_IF_SOME(method, consumeHttpMethod(ptr)) {
    if (*ptr != ' ' && *ptr != '\t') {
      return ProtocolError { 501, "Not Implemented",
          "Unrecognized request method.", content };
    }
    ++ptr;

    kj::Maybe<StringPtr> path;
    KJ_IF_SOME(p, consumeWord(ptr)) {
      path = p;
    } else {
      return ProtocolError { 400, "Bad Request",
          "Invalid request line.", content };
    }

    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        result = HttpHeaders::Request { m, KJ_ASSERT_NONNULL(path) };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        result = HttpHeaders::ConnectRequest { KJ_ASSERT_NONNULL(path) };
      }
    }
  }